

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O0

string * __thiscall CppGenerator::genSortFunction_abi_cxx11_(CppGenerator *this,size_t *rel_id)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  Attribute *pAVar2;
  TreeDecomposition *in_RDI;
  string *attrName;
  size_t var;
  string returnString;
  string sortAlgo;
  string relName;
  TDNode *relation;
  size_t in_stack_fffffffffffff8a8;
  TreeDecomposition *in_stack_fffffffffffff8b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  TreeDecomposition *this_00;
  string local_728 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff8e0;
  CppGenerator *in_stack_fffffffffffff8e8;
  string local_708 [32];
  string local_6e8 [32];
  string local_6c8 [32];
  string local_6a8 [32];
  string local_688 [32];
  string local_668 [32];
  string local_648 [32];
  string local_628 [32];
  string local_608 [32];
  string local_5e8 [32];
  string local_5c8 [32];
  string local_5a8 [32];
  string local_588 [32];
  string local_568 [32];
  string local_548 [32];
  string local_528 [32];
  string local_508 [32];
  string local_4e8 [32];
  string local_4c8 [32];
  string local_4a8 [32];
  string local_488 [32];
  string local_468 [32];
  string local_448 [32];
  string local_428 [32];
  string local_408 [32];
  string local_3e8 [32];
  string local_3c8 [32];
  string local_3a8 [32];
  string local_388 [32];
  string *local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_360;
  string local_358 [32];
  string local_338 [32];
  string local_318 [32];
  string local_2f8 [32];
  string local_2d8 [32];
  string local_2b8 [32];
  string local_298 [32];
  string local_278 [32];
  string local_258 [32];
  string local_238 [32];
  string local_218 [32];
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [55];
  allocator local_61;
  string local_60 [32];
  string local_40 [32];
  TDNode *local_20;
  
  this_00 = in_RDI;
  std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x29fdb2);
  local_20 = TreeDecomposition::getRelation(in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8);
  std::__cxx11::string::string(local_40,(string *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"std::sort(",&local_61);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  offset_abi_cxx11_(in_stack_fffffffffffff8e8,(size_t)in_stack_fffffffffffff8e0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                 (char *)in_stack_fffffffffffff8b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff8b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                 (char *)in_stack_fffffffffffff8b0);
  offset_abi_cxx11_(in_stack_fffffffffffff8e8,(size_t)in_stack_fffffffffffff8e0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                 (char *)in_stack_fffffffffffff8b0);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string(local_158);
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::~string(local_f8);
  std::__cxx11::string::~string(local_118);
  std::__cxx11::string::~string(local_138);
  if ((multifaq::cppgen::BENCH_INDIVIDUAL & 1) != 0) {
    offset_abi_cxx11_(in_stack_fffffffffffff8e8,(size_t)in_stack_fffffffffffff8e0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                   (char *)in_stack_fffffffffffff8b0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                   (char *)in_stack_fffffffffffff8b0);
    std::__cxx11::string::operator+=(local_98,local_178);
    std::__cxx11::string::~string(local_178);
    std::__cxx11::string::~string(local_198);
    std::__cxx11::string::~string(local_1b8);
  }
  offset_abi_cxx11_(in_stack_fffffffffffff8e8,(size_t)in_stack_fffffffffffff8e0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff8b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff8b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                 (char *)in_stack_fffffffffffff8b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff8b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                 (char *)in_stack_fffffffffffff8b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff8b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                 (char *)in_stack_fffffffffffff8b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff8b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                 (char *)in_stack_fffffffffffff8b0);
  offset_abi_cxx11_(in_stack_fffffffffffff8e8,(size_t)in_stack_fffffffffffff8e0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                 (char *)in_stack_fffffffffffff8b0);
  std::__cxx11::string::operator+=(local_98,local_1d8);
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::string::~string(local_1f8);
  std::__cxx11::string::~string(local_358);
  std::__cxx11::string::~string(local_218);
  std::__cxx11::string::~string(local_238);
  std::__cxx11::string::~string(local_258);
  std::__cxx11::string::~string(local_278);
  std::__cxx11::string::~string(local_298);
  std::__cxx11::string::~string(local_2b8);
  std::__cxx11::string::~string(local_2d8);
  std::__cxx11::string::~string(local_2f8);
  std::__cxx11::string::~string(local_318);
  std::__cxx11::string::~string(local_338);
  local_360 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  while( true ) {
    __rhs = local_360;
    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::bitset<100UL>::count((bitset<100UL> *)0x2a03e7);
    if (pbVar1 <= __rhs) break;
    std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x2a0406);
    pAVar2 = TreeDecomposition::getAttribute(this_00,(size_t)in_RDI);
    local_368 = &pAVar2->_name;
    offset_abi_cxx11_(in_stack_fffffffffffff8e8,(size_t)in_stack_fffffffffffff8e0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                   (char *)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,__rhs
                  );
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                   (char *)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,__rhs
                  );
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                   (char *)__rhs);
    offset_abi_cxx11_(in_stack_fffffffffffff8e8,(size_t)in_stack_fffffffffffff8e0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                   (char *)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,__rhs
                  );
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                   (char *)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,__rhs
                  );
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                   (char *)__rhs);
    std::__cxx11::string::operator+=(local_98,local_388);
    std::__cxx11::string::~string(local_388);
    std::__cxx11::string::~string(local_3a8);
    std::__cxx11::string::~string(local_3c8);
    std::__cxx11::string::~string(local_3e8);
    std::__cxx11::string::~string(local_408);
    std::__cxx11::string::~string(local_428);
    std::__cxx11::string::~string(local_508);
    std::__cxx11::string::~string(local_448);
    std::__cxx11::string::~string(local_468);
    std::__cxx11::string::~string(local_488);
    std::__cxx11::string::~string(local_4a8);
    std::__cxx11::string::~string(local_4c8);
    std::__cxx11::string::~string(local_4e8);
    local_360 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &local_360->field_0x1;
  }
  offset_abi_cxx11_(in_stack_fffffffffffff8e8,(size_t)in_stack_fffffffffffff8e0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                 (char *)__rhs);
  offset_abi_cxx11_(in_stack_fffffffffffff8e8,(size_t)in_stack_fffffffffffff8e0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                 (char *)__rhs);
  std::__cxx11::string::operator+=(local_98,local_528);
  std::__cxx11::string::~string(local_528);
  std::__cxx11::string::~string(local_548);
  std::__cxx11::string::~string(local_5a8);
  std::__cxx11::string::~string(local_568);
  std::__cxx11::string::~string(local_588);
  if ((multifaq::cppgen::BENCH_INDIVIDUAL & 1) != 0) {
    offset_abi_cxx11_(in_stack_fffffffffffff8e8,(size_t)in_stack_fffffffffffff8e0);
    std::operator+((char *)in_RDI,__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                   (char *)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                   (char *)__rhs);
    offset_abi_cxx11_(in_stack_fffffffffffff8e8,(size_t)in_stack_fffffffffffff8e0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                   (char *)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,__rhs
                  );
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                   (char *)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                   (char *)__rhs);
    std::__cxx11::string::operator+=(local_98,local_5c8);
    std::__cxx11::string::~string(local_5c8);
    std::__cxx11::string::~string(local_5e8);
    std::__cxx11::string::~string(local_608);
    std::__cxx11::string::~string(local_628);
    std::__cxx11::string::~string(local_648);
    std::__cxx11::string::~string(local_6e8);
    std::__cxx11::string::~string(local_668);
    std::__cxx11::string::~string(local_688);
    std::__cxx11::string::~string(local_6a8);
    std::__cxx11::string::~string(local_6c8);
  }
  offset_abi_cxx11_(in_stack_fffffffffffff8e8,(size_t)in_stack_fffffffffffff8e0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                 (char *)__rhs);
  std::__cxx11::string::~string(local_708);
  std::__cxx11::string::~string(local_728);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_40);
  return (string *)this_00;
}

Assistant:

std::string CppGenerator::genSortFunction(const size_t& rel_id)
{
    TDNode* relation = _td->getRelation(rel_id);
    std::string relName = relation->_name;

#if defined(__GNUC__) && defined(NDEBUG) && !defined(__clang__)
    std::string sortAlgo = "__gnu_parallel::sort(";
#else
    std::string sortAlgo = "std::sort(";
#endif
    
    std::string returnString = offset(1)+"void sort"+relName+"()\n"+offset(1)+"{\n";

    if (BENCH_INDIVIDUAL)
        returnString += offset(2)+"int64_t startProcess = duration_cast<milliseconds>("+
            "system_clock::now().time_since_epoch()).count();\n\n";

    returnString += offset(2)+sortAlgo+relName+".begin(),"+
        relName+".end(),[ ](const "+relName+"_tuple& lhs, const "+relName+
        "_tuple& rhs)\n"+offset(2)+"{\n";

    // size_t orderIdx = 0;
    // for (const size_t& var : varOrder)
    // {
    //     if (baseRelation->_bag[var])
    //     {
    //         const std::string& attrName = _td->getAttribute(var)->_name;
    //         returnString += offset(3)+"if(lhs."+attrName+" != rhs."+attrName+")\n"+
    //             offset(4)+"return lhs."+attrName+" < rhs."+attrName+";\n";
    //         // Reset the relSortOrder array for future calls 
    //         sortOrders[view->_origin][orderIdx] = var;
    //         ++orderIdx;
    //     }
    // }

    for (size_t var = 0; var < relation->_bag.count(); ++var)
    {
        const std::string& attrName = _td->getAttribute(sortOrders[rel_id][var])->_name;
        returnString += offset(3)+"if(lhs."+attrName+" != rhs."+attrName+")\n"+
            offset(4)+"return lhs."+attrName+" < rhs."+attrName+";\n";
    }
    returnString += offset(3)+"return false;\n"+offset(2)+"});\n";

    if (BENCH_INDIVIDUAL)
        returnString += "\n"+offset(2)+
            "int64_t endProcess = duration_cast<milliseconds>("+
            "system_clock::now().time_since_epoch()).count()-startProcess;\n"+
            offset(2)+"std::cout << \"Sort Relation "+relName+": \"+"+
            "std::to_string(endProcess)+\"ms.\\n\";\n\n";    
        // offset(2)+"std::ofstream ofs(\"times.txt\",std::ofstream::out | " +
        // "std::ofstream::app);\n"+
        // offset(2)+"ofs << \"\\t\" << endProcess;\n"+
        // offset(2)+"ofs.close();\n";
    
    return returnString+offset(1)+"}\n";
}